

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612_Emu.cpp
# Opt level: O1

int __thiscall Ym2612_Impl::YM_SET(Ym2612_Impl *this,int Adr,int data)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  int iVar5;
  
  switch(Adr) {
  case 0x22:
    if ((data & 8U) == 0) {
      (this->g).LFOcnt = 0;
      (this->g).LFOinc = 0;
    }
    else {
      (this->g).LFOinc = (this->g).LFO_INC_TAB[data & 7];
    }
    break;
  case 0x24:
    iVar2 = ((this->YM2612).TimerA & 3U) + data * 4;
    (this->YM2612).TimerA = iVar2;
    iVar2 = iVar2 * -0x1000 + 0x400000;
    if ((this->YM2612).TimerAL == iVar2) {
      return 0;
    }
    goto LAB_006c1edc;
  case 0x25:
    uVar3 = data & 3U | (this->YM2612).TimerA & 0x3fcU;
    (this->YM2612).TimerA = uVar3;
    iVar2 = uVar3 * -0x1000 + 0x400000;
    if ((this->YM2612).TimerAL == iVar2) {
      return 0;
    }
LAB_006c1edc:
    (this->YM2612).TimerAL = iVar2;
    (this->YM2612).TimerAcnt = iVar2;
    break;
  case 0x26:
    (this->YM2612).TimerB = data;
    iVar2 = data * -0x10000 + 0x1000000;
    if ((this->YM2612).TimerBL != iVar2) {
      (this->YM2612).TimerBL = iVar2;
      (this->YM2612).TimerBcnt = iVar2;
    }
    break;
  case 0x27:
    if ((((this->YM2612).Mode ^ data) & 0x40U) != 0) {
      (this->YM2612).CHANNEL[2].SLOT[0].Finc = -1;
    }
    piVar4 = &(this->YM2612).Status;
    *piVar4 = *piVar4 & data >> 2 & ~(data >> 4);
    (this->YM2612).Mode = data;
    break;
  case 0x28:
    uVar3 = data & 3;
    if (uVar3 == 3) {
      return 1;
    }
    uVar1 = uVar3 + 3;
    if ((data & 4U) == 0) {
      uVar1 = uVar3;
    }
    iVar2 = (this->YM2612).CHANNEL[uVar1].SLOT[0].Ecurp;
    if ((data & 0x10U) == 0) {
      if (iVar2 != 3) {
        iVar2 = (this->YM2612).CHANNEL[uVar1].SLOT[0].Ecnt;
        if (iVar2 < 0x10000000) {
          (this->YM2612).CHANNEL[uVar1].SLOT[0].Ecnt =
               (uint)(ushort)(this->g).ENV_TAB[iVar2 >> 0x10] * 0x10000 + 0x10000000;
        }
        piVar4 = &(this->YM2612).CHANNEL[uVar1].SLOT[0].EincR;
        iVar2 = 3;
        iVar5 = 0x20000000;
LAB_006c1f9a:
        (this->YM2612).CHANNEL[uVar1].SLOT[0].Einc = *piVar4;
        (this->YM2612).CHANNEL[uVar1].SLOT[0].Ecmp = iVar5;
        (this->YM2612).CHANNEL[uVar1].SLOT[0].Ecurp = iVar2;
      }
    }
    else if (iVar2 == 3) {
      (this->YM2612).CHANNEL[uVar1].SLOT[0].Fcnt = 0;
      (this->YM2612).CHANNEL[uVar1].SLOT[0].Ecnt =
           (this->YM2612).CHANNEL[uVar1].SLOT[0].ChgEnM &
           (this->g).DECAY_TO_ATTACK
           [(this->g).ENV_TAB[*(short *)((long)&(this->YM2612).CHANNEL[uVar1].SLOT[0].Ecnt + 2)]];
      (this->YM2612).CHANNEL[uVar1].SLOT[0].ChgEnM = -1;
      piVar4 = &(this->YM2612).CHANNEL[uVar1].SLOT[0].EincA;
      iVar2 = 0;
      iVar5 = 0x10000000;
      goto LAB_006c1f9a;
    }
    iVar2 = (this->YM2612).CHANNEL[uVar1].SLOT[2].Ecurp;
    if ((data & 0x20U) == 0) {
      if (iVar2 != 3) {
        iVar2 = (this->YM2612).CHANNEL[uVar1].SLOT[2].Ecnt;
        if (iVar2 < 0x10000000) {
          (this->YM2612).CHANNEL[uVar1].SLOT[2].Ecnt =
               (uint)(ushort)(this->g).ENV_TAB[iVar2 >> 0x10] * 0x10000 + 0x10000000;
        }
        piVar4 = &(this->YM2612).CHANNEL[uVar1].SLOT[2].EincR;
        iVar2 = 3;
        iVar5 = 0x20000000;
LAB_006c2060:
        (this->YM2612).CHANNEL[uVar1].SLOT[2].Einc = *piVar4;
        (this->YM2612).CHANNEL[uVar1].SLOT[2].Ecmp = iVar5;
        (this->YM2612).CHANNEL[uVar1].SLOT[2].Ecurp = iVar2;
      }
    }
    else if (iVar2 == 3) {
      (this->YM2612).CHANNEL[uVar1].SLOT[2].Fcnt = 0;
      (this->YM2612).CHANNEL[uVar1].SLOT[2].Ecnt =
           (this->YM2612).CHANNEL[uVar1].SLOT[2].ChgEnM &
           (this->g).DECAY_TO_ATTACK
           [(this->g).ENV_TAB[*(short *)((long)&(this->YM2612).CHANNEL[uVar1].SLOT[2].Ecnt + 2)]];
      (this->YM2612).CHANNEL[uVar1].SLOT[2].ChgEnM = -1;
      piVar4 = &(this->YM2612).CHANNEL[uVar1].SLOT[2].EincA;
      iVar2 = 0;
      iVar5 = 0x10000000;
      goto LAB_006c2060;
    }
    iVar2 = (this->YM2612).CHANNEL[uVar1].SLOT[1].Ecurp;
    if ((data & 0x40U) == 0) {
      if (iVar2 != 3) {
        iVar2 = (this->YM2612).CHANNEL[uVar1].SLOT[1].Ecnt;
        if (iVar2 < 0x10000000) {
          (this->YM2612).CHANNEL[uVar1].SLOT[1].Ecnt =
               (uint)(ushort)(this->g).ENV_TAB[iVar2 >> 0x10] * 0x10000 + 0x10000000;
        }
        piVar4 = &(this->YM2612).CHANNEL[uVar1].SLOT[1].EincR;
        iVar2 = 3;
        iVar5 = 0x20000000;
LAB_006c2126:
        (this->YM2612).CHANNEL[uVar1].SLOT[1].Einc = *piVar4;
        (this->YM2612).CHANNEL[uVar1].SLOT[1].Ecmp = iVar5;
        (this->YM2612).CHANNEL[uVar1].SLOT[1].Ecurp = iVar2;
      }
    }
    else if (iVar2 == 3) {
      (this->YM2612).CHANNEL[uVar1].SLOT[1].Fcnt = 0;
      (this->YM2612).CHANNEL[uVar1].SLOT[1].Ecnt =
           (this->YM2612).CHANNEL[uVar1].SLOT[1].ChgEnM &
           (this->g).DECAY_TO_ATTACK
           [(this->g).ENV_TAB[*(short *)((long)&(this->YM2612).CHANNEL[uVar1].SLOT[1].Ecnt + 2)]];
      (this->YM2612).CHANNEL[uVar1].SLOT[1].ChgEnM = -1;
      piVar4 = &(this->YM2612).CHANNEL[uVar1].SLOT[1].EincA;
      iVar2 = 0;
      iVar5 = 0x10000000;
      goto LAB_006c2126;
    }
    iVar2 = (this->YM2612).CHANNEL[uVar1].SLOT[3].Ecurp;
    if ((char)data < '\0') {
      if (iVar2 == 3) {
        (this->YM2612).CHANNEL[uVar1].SLOT[3].Fcnt = 0;
        (this->YM2612).CHANNEL[uVar1].SLOT[3].Ecnt =
             (this->YM2612).CHANNEL[uVar1].SLOT[3].ChgEnM &
             (this->g).DECAY_TO_ATTACK
             [(this->g).ENV_TAB[*(short *)((long)&(this->YM2612).CHANNEL[uVar1].SLOT[3].Ecnt + 2)]];
        (this->YM2612).CHANNEL[uVar1].SLOT[3].ChgEnM = -1;
        piVar4 = &(this->YM2612).CHANNEL[uVar1].SLOT[3].EincA;
        iVar2 = 0;
        iVar5 = 0x10000000;
        goto LAB_006c21e2;
      }
    }
    else if (iVar2 != 3) {
      iVar2 = (this->YM2612).CHANNEL[uVar1].SLOT[3].Ecnt;
      if (iVar2 < 0x10000000) {
        (this->YM2612).CHANNEL[uVar1].SLOT[3].Ecnt =
             (uint)(ushort)(this->g).ENV_TAB[iVar2 >> 0x10] * 0x10000 + 0x10000000;
      }
      piVar4 = &(this->YM2612).CHANNEL[uVar1].SLOT[3].EincR;
      iVar2 = 3;
      iVar5 = 0x20000000;
LAB_006c21e2:
      (this->YM2612).CHANNEL[uVar1].SLOT[3].Einc = *piVar4;
      (this->YM2612).CHANNEL[uVar1].SLOT[3].Ecmp = iVar5;
      (this->YM2612).CHANNEL[uVar1].SLOT[3].Ecurp = iVar2;
    }
    if (uVar3 == 3) {
      return 1;
    }
    break;
  case 0x2b:
    (this->YM2612).DAC = data & 0x80;
  }
  return 0;
}

Assistant:

int Ym2612_Impl::YM_SET(int Adr, int data)
{
	switch ( Adr )
	{
		case 0x22:
			if (data & 8) // LFO enable
			{
				// Cool Spot music 1, LFO modified severals time which
				// distord the sound, have to check that on a real genesis...

				g.LFOinc = g.LFO_INC_TAB [data & 7];
			}
			else
			{
				g.LFOinc = g.LFOcnt = 0;
			}
			break;

		case 0x24:
			YM2612.TimerA = (YM2612.TimerA & 0x003) | (((int) data) << 2);

			if (YM2612.TimerAL != (1024 - YM2612.TimerA) << 12)
			{
				YM2612.TimerAcnt = YM2612.TimerAL = (1024 - YM2612.TimerA) << 12;
			}
			break;

		case 0x25:
			YM2612.TimerA = (YM2612.TimerA & 0x3FC) | (data & 3);

			if (YM2612.TimerAL != (1024 - YM2612.TimerA) << 12)
			{
				YM2612.TimerAcnt = YM2612.TimerAL = (1024 - YM2612.TimerA) << 12;
			}
			break;

		case 0x26:
			YM2612.TimerB = data;

			if (YM2612.TimerBL != (256 - YM2612.TimerB) << (4 + 12))
			{
				YM2612.TimerBcnt = YM2612.TimerBL = (256 - YM2612.TimerB) << (4 + 12);
			}
			break;

		case 0x27:
			// Parametre divers
			// b7 = CSM MODE
			// b6 = 3 slot mode
			// b5 = reset b
			// b4 = reset a
			// b3 = timer enable b
			// b2 = timer enable a
			// b1 = load b
			// b0 = load a

			if ((data ^ YM2612.Mode) & 0x40)
			{
				// We changed the channel 2 mode, so recalculate phase step
				// This fix the punch sound in Street of Rage 2

				YM2612_Special_Update();

				YM2612.CHANNEL [2].SLOT [0].Finc = -1;      // recalculate phase step
			}

//          if ((data & 2) && (YM2612.Status & 2)) YM2612.TimerBcnt = YM2612.TimerBL;
//          if ((data & 1) && (YM2612.Status & 1)) YM2612.TimerAcnt = YM2612.TimerAL;

//          YM2612.Status &= (~data >> 4);                  // Reset du Status au cas ou c'est demande
			YM2612.Status &= (~data >> 4) & (data >> 2);    // Reset Status

			YM2612.Mode = data;
			break;

		case 0x28: {
			int nch = data & 3;
			if ( nch == 3 )
				return 1;
			if ( data & 4 )
				nch += 3;
			channel_t& ch = YM2612.CHANNEL [nch];

			YM2612_Special_Update();

			if (data & 0x10) KEY_ON(ch, S0);    // On appuie sur la touche pour le slot 1
			else KEY_OFF(ch, S0);               // On rel'che la touche pour le slot 1
			if (data & 0x20) KEY_ON(ch, S1);    // On appuie sur la touche pour le slot 3
			else KEY_OFF(ch, S1);               // On rel'che la touche pour le slot 3
			if (data & 0x40) KEY_ON(ch, S2);    // On appuie sur la touche pour le slot 2
			else KEY_OFF(ch, S2);               // On rel'che la touche pour le slot 2
			if (data & 0x80) KEY_ON(ch, S3);    // On appuie sur la touche pour le slot 4
			else KEY_OFF(ch, S3);               // On rel'che la touche pour le slot 4
			break;
		}
		
		case 0x2B:
			if (YM2612.DAC ^ (data & 0x80)) YM2612_Special_Update();

			YM2612.DAC = data & 0x80;   // activation/desactivation du DAC
			break;
	}
	
	return 0;
}